

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_ast_eq(mpc_ast_t *a,mpc_ast_t *b)

{
  int iVar1;
  int iVar2;
  mpc_ast_t *in_RSI;
  undefined8 *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  iVar1 = strcmp((char *)*in_RDI,in_RSI->tag);
  if (iVar1 == 0) {
    iVar1 = strcmp((char *)in_RDI[1],in_RSI->contents);
    if (iVar1 == 0) {
      if (*(int *)(in_RDI + 6) == in_RSI->children_num) {
        for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 6); iVar1 = iVar1 + 1) {
          iVar2 = mpc_ast_eq(in_RSI,(mpc_ast_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
          if (iVar2 == 0) {
            return 0;
          }
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mpc_ast_eq(mpc_ast_t *a, mpc_ast_t *b) {

  int i;

  if (strcmp(a->tag, b->tag) != 0) { return 0; }
  if (strcmp(a->contents, b->contents) != 0) { return 0; }
  if (a->children_num != b->children_num) { return 0; }

  for (i = 0; i < a->children_num; i++) {
    if (!mpc_ast_eq(a->children[i], b->children[i])) { return 0; }
  }

  return 1;
}